

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int skip_sfx(archive_read *a,ssize_t bytes_avail)

{
  int64_t iVar1;
  void *pvVar2;
  long in_RSI;
  archive *in_RDI;
  _7zip *zip;
  int step;
  ssize_t window;
  ssize_t bytes;
  size_t offset;
  size_t skip;
  char *q;
  char *p;
  void *h;
  size_t in_stack_ffffffffffffff98;
  archive_read *in_stack_ffffffffffffffa0;
  archive_read *a_00;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  ulong local_50;
  long local_48;
  long local_40;
  void *local_28;
  
  if (in_RSI < 0x27001) {
    iVar1 = __archive_read_seek(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
    if (iVar1 < 0) {
      return -0x1e;
    }
  }
  else {
    __archive_read_consume(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  local_40 = 0;
  local_50 = 1;
  do {
    while( true ) {
      if (0x39000 < local_40 + local_50) goto LAB_0019e0ca;
      pvVar2 = __archive_read_ahead
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(ssize_t *)0x19df8c);
      if (pvVar2 == (void *)0x0) break;
      if (local_48 < 6) {
        local_50 = 0x1000;
      }
      else {
        for (local_28 = pvVar2; (long)local_28 + 0x20U < (ulong)((long)pvVar2 + local_48);
            local_28 = (void *)((long)local_28 + (long)in_stack_ffffffffffffffac)) {
          in_stack_ffffffffffffffac =
               check_7zip_header_in_sfx
                         ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          if (in_stack_ffffffffffffffac == 0) {
            a_00 = *(archive_read **)in_RDI[0x15].archive_format_name;
            __archive_read_consume(a_00,in_stack_ffffffffffffff98);
            a_00->skip_file_ino = (long)local_28 + ((local_40 + 0x27000) - (long)pvVar2);
            return 0;
          }
        }
        __archive_read_consume(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        local_40 = (long)local_28 + (local_40 - (long)pvVar2);
        if (local_50 == 1) {
          local_50 = 0x1000;
        }
      }
    }
    local_50 = (long)local_50 >> 1;
  } while (0x3f < local_50);
LAB_0019e0ca:
  archive_set_error(in_RDI,0x54,"Couldn\'t find out 7-Zip header");
  return -0x1e;
}

Assistant:

static int
skip_sfx(struct archive_read *a, ssize_t bytes_avail)
{
	const void *h;
	const char *p, *q;
	size_t skip, offset;
	ssize_t bytes, window;

	/*
	 * If bytes_avail > SFX_MIN_ADDR we do not have to call
	 * __archive_read_seek() at this time since we have
	 * alredy had enough data.
	 */
	if (bytes_avail > SFX_MIN_ADDR)
		__archive_read_consume(a, SFX_MIN_ADDR);
	else if (__archive_read_seek(a, SFX_MIN_ADDR, SEEK_SET) < 0)
		return (ARCHIVE_FATAL);

	offset = 0;
	window = 1;
	while (offset + window <= SFX_MAX_ADDR - SFX_MIN_ADDR) {
		h = __archive_read_ahead(a, window, &bytes);
		if (h == NULL) {
			/* Remaining bytes are less than window. */
			window >>= 1;
			if (window < 0x40)
				goto fatal;
			continue;
		}
		if (bytes < 6) {
			/* This case might happen when window == 1. */
			window = 4096;
			continue;
		}
		p = (const char *)h;
		q = p + bytes;

		/*
		 * Scan ahead until we find something that looks
		 * like the 7-Zip header.
		 */
		while (p + 32 < q) {
			int step = check_7zip_header_in_sfx(p);
			if (step == 0) {
				struct _7zip *zip =
				    (struct _7zip *)a->format->data;
				skip = p - (const char *)h;
				__archive_read_consume(a, skip);
				zip->seek_base = SFX_MIN_ADDR + offset + skip;
				return (ARCHIVE_OK);
			}
			p += step;
		}
		skip = p - (const char *)h;
		__archive_read_consume(a, skip);
		offset += skip;
		if (window == 1)
			window = 4096;
	}
fatal:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Couldn't find out 7-Zip header");
	return (ARCHIVE_FATAL);
}